

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_alloc_helpers.hpp
# Opt level: O0

void * asio_handler_alloc_helpers::
       allocate<tonk::gateway::HTTPRequester::ContinueReadingBody()::__0>
                 (size_t s,anon_class_8_1_8991fb9c_for_handler_ *h)

{
  void *pvVar1;
  undefined8 in_RSI;
  size_t in_RDI;
  
  pvVar1 = asio::asio_handler_allocate(in_RDI,in_RSI);
  return pvVar1;
}

Assistant:

inline void* allocate(std::size_t s, Handler& h)
{
#if !defined(ASIO_HAS_HANDLER_HOOKS)
  return ::operator new(s);
#else
  using asio::asio_handler_allocate;
  return asio_handler_allocate(s, asio::detail::addressof(h));
#endif
}